

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::RgbaInputFile::readPixels(RgbaInputFile *this,int scanLine1,int scanLine2)

{
  char *pcVar1;
  size_t sVar2;
  RgbaChannels RVar3;
  int iVar4;
  string *name;
  Slice *pSVar5;
  char *pcVar6;
  int in_EDX;
  int in_ESI;
  FromYca *in_RDI;
  Rgba *pixel;
  int x;
  intptr_t rowBase;
  int scanLine;
  intptr_t base;
  Box2i dataWindow;
  Slice *s;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff58;
  RgbaInputFile *in_stack_ffffffffffffff60;
  Box<Imath_3_2::Vec2<int>_> *this_00;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  int local_6c;
  int local_60;
  int local_58;
  Box<Imath_3_2::Vec2<int>_> local_50 [2];
  Slice *local_30;
  int local_10;
  int local_c;
  
  if ((in_RDI->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev ==
      (__pthread_internal_list *)0x0) {
    local_10 = in_EDX;
    local_c = in_ESI;
    InputPart::readPixels
              ((InputPart *)in_stack_ffffffffffffff60,
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
    RVar3 = channels(in_stack_ffffffffffffff60);
    if ((RVar3 & WRITE_Y) != 0) {
      name = (string *)InputPart::frameBuffer((InputPart *)0x222d6d);
      this_00 = local_50;
      std::operator+(in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      pSVar5 = FrameBuffer::findSlice((FrameBuffer *)this_00,name);
      std::__cxx11::string::~string((string *)local_50);
      local_30 = pSVar5;
      InputPart::header((InputPart *)0x222dc7);
      Header::dataWindow((Header *)0x222dcf);
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(this_00,(Box<Imath_3_2::Vec2<int>_> *)name);
      pcVar1 = local_30->base;
      for (local_6c = local_c; local_6c <= local_10; local_6c = local_6c + 1) {
        sVar2 = local_30->yStride;
        for (iVar4 = local_60; iVar4 <= local_58; iVar4 = iVar4 + 1) {
          pcVar6 = pcVar1 + (long)iVar4 * local_30->xStride + (long)local_6c * sVar2;
          *(undefined2 *)(pcVar6 + 2) = *(undefined2 *)pcVar6;
          *(undefined2 *)(pcVar6 + 4) = *(undefined2 *)pcVar6;
        }
      }
    }
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    FromYca::readPixels(in_RDI,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (int)in_stack_ffffffffffffff68);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x222d02);
  }
  return;
}

Assistant:

void
RgbaInputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_fromYca)
    {
        std::lock_guard<std::mutex> lock (*_fromYca);
        _fromYca->readPixels (scanLine1, scanLine2);
    }
    else
    {
        _inputPart->readPixels (scanLine1, scanLine2);

        if (channels () & WRITE_Y)
        {
            //
            // Luma channel has been written into red channel
            // Duplicate into green and blue channel to create gray image
            //
            const Slice* s =
                _inputPart->frameBuffer ().findSlice (_channelNamePrefix + "Y");
            Box2i    dataWindow = _inputPart->header ().dataWindow ();
            intptr_t base       = reinterpret_cast<intptr_t> (s->base);

            for (int scanLine = scanLine1; scanLine <= scanLine2; scanLine++)
            {
                intptr_t rowBase = base + scanLine * s->yStride;
                for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
                {
                    Rgba* pixel =
                        reinterpret_cast<Rgba*> (rowBase + x * s->xStride);
                    pixel->g = pixel->r;
                    pixel->b = pixel->r;
                }
            }
        }
    }
}